

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxNextMethod(sqlite3_vtab_cursor *pCursor)

{
  int iVar1;
  int local_5c;
  sqlite_int64 local_58;
  sqlite3_int64 v;
  int mc;
  int n;
  int eState;
  int iCol;
  char *aDoclist;
  int local_30;
  int nDoclist;
  int i;
  int rc;
  Fts3Table *pFts3;
  Fts3auxCursor *pCsr;
  sqlite3_vtab_cursor *pCursor_local;
  
  _i = (Fts3Table *)pCursor->pVtab[1].pModule;
  pCursor[0x12].pVtab = (sqlite3_vtab *)((long)&(pCursor[0x12].pVtab)->pModule + 1);
  *(int *)&pCursor[0x13].pVtab = *(int *)&pCursor[0x13].pVtab + 1;
  while (*(int *)&pCursor[0x13].pVtab < *(int *)((long)&pCursor[0x13].pVtab + 4)) {
    if (0 < (long)(&(pCursor[0x14].pVtab)->pModule)[(long)*(int *)&pCursor[0x13].pVtab * 2]) {
      return 0;
    }
    *(int *)&pCursor[0x13].pVtab = *(int *)&pCursor[0x13].pVtab + 1;
  }
  pFts3 = (Fts3Table *)pCursor;
  pCsr = (Fts3auxCursor *)pCursor;
  nDoclist = sqlite3Fts3SegReaderStep(_i,(Fts3MultiSegReader *)(pCursor + 1));
  if (nDoclist == 100) {
    local_30 = 0;
    aDoclist._4_4_ = *(int *)&pFts3->zLanguageid;
    _eState = pFts3->zContentTbl;
    mc = 0;
    if (pFts3->aStmt[2] != (sqlite3_stmt *)0x0) {
      if (*(int *)(pFts3->aStmt + 3) < *(int *)&pFts3->pTokenizer) {
        local_5c = *(int *)(pFts3->aStmt + 3);
      }
      else {
        local_5c = *(int *)&pFts3->pTokenizer;
      }
      v._4_4_ = local_5c;
      v._0_4_ = memcmp(pFts3->aStmt[2],pFts3->abNotindexed,(long)local_5c);
      if (((int)v < 0) ||
         (((int)v == 0 && (*(int *)(pFts3->aStmt + 3) < *(int *)&pFts3->pTokenizer)))) {
        *(undefined4 *)(pFts3->aStmt + 4) = 1;
        return 0;
      }
    }
    iVar1 = fts3auxGrowStatArray((Fts3auxCursor *)pFts3,2);
    if (iVar1 != 0) {
      return 7;
    }
    memset(pFts3->aStmt[7],0,(long)*(int *)((long)pFts3->aStmt + 0x34) << 4);
    n = 0;
    while (local_30 < aDoclist._4_4_) {
      local_58 = 0;
      iVar1 = sqlite3Fts3GetVarint(_eState + local_30,&local_58);
      local_30 = local_30 + iVar1;
      if (mc == 0) {
        *(long *)pFts3->aStmt[7] = *(long *)pFts3->aStmt[7] + 1;
        mc = 1;
        n = 0;
      }
      else if (mc == 1) {
        if (1 < local_58) {
          *(long *)(pFts3->aStmt[7] + 0x10) = *(long *)(pFts3->aStmt[7] + 0x10) + 1;
        }
        mc = 2;
LAB_001f413b:
        if (local_58 == 0) {
          mc = 0;
        }
        else if (local_58 == 1) {
          mc = 3;
        }
        else {
          *(long *)(pFts3->aStmt[7] + (long)(n + 1) * 0x10 + 8) =
               *(long *)(pFts3->aStmt[7] + (long)(n + 1) * 0x10 + 8) + 1;
          *(long *)(pFts3->aStmt[7] + 8) = *(long *)(pFts3->aStmt[7] + 8) + 1;
        }
      }
      else {
        if (mc == 2) goto LAB_001f413b;
        n = (int)local_58;
        iVar1 = fts3auxGrowStatArray((Fts3auxCursor *)pFts3,n + 2);
        if (iVar1 != 0) {
          return 7;
        }
        *(long *)(pFts3->aStmt[7] + (long)(n + 1) * 0x10) =
             *(long *)(pFts3->aStmt[7] + (long)(n + 1) * 0x10) + 1;
        mc = 2;
      }
    }
    *(undefined4 *)(pFts3->aStmt + 6) = 0;
    nDoclist = 0;
  }
  else {
    *(undefined4 *)(pFts3->aStmt + 4) = 1;
  }
  return nDoclist;
}

Assistant:

static int fts3auxNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts3auxCursor *pCsr = (Fts3auxCursor *)pCursor;
  Fts3Table *pFts3 = ((Fts3auxTable *)pCursor->pVtab)->pFts3Tab;
  int rc;

  /* Increment our pretend rowid value. */
  pCsr->iRowid++;

  for(pCsr->iCol++; pCsr->iCol<pCsr->nStat; pCsr->iCol++){
    if( pCsr->aStat[pCsr->iCol].nDoc>0 ) return SQLITE_OK;
  }

  rc = sqlite3Fts3SegReaderStep(pFts3, &pCsr->csr);
  if( rc==SQLITE_ROW ){
    int i = 0;
    int nDoclist = pCsr->csr.nDoclist;
    char *aDoclist = pCsr->csr.aDoclist;
    int iCol;

    int eState = 0;

    if( pCsr->zStop ){
      int n = (pCsr->nStop<pCsr->csr.nTerm) ? pCsr->nStop : pCsr->csr.nTerm;
      int mc = memcmp(pCsr->zStop, pCsr->csr.zTerm, n);
      if( mc<0 || (mc==0 && pCsr->csr.nTerm>pCsr->nStop) ){
        pCsr->isEof = 1;
        return SQLITE_OK;
      }
    }

    if( fts3auxGrowStatArray(pCsr, 2) ) return SQLITE_NOMEM;
    memset(pCsr->aStat, 0, sizeof(struct Fts3auxColstats) * pCsr->nStat);
    iCol = 0;

    while( i<nDoclist ){
      sqlite3_int64 v = 0;

      i += sqlite3Fts3GetVarint(&aDoclist[i], &v);
      switch( eState ){
        /* State 0. In this state the integer just read was a docid. */
        case 0:
          pCsr->aStat[0].nDoc++;
          eState = 1;
          iCol = 0;
          break;

        /* State 1. In this state we are expecting either a 1, indicating
        ** that the following integer will be a column number, or the
        ** start of a position list for column 0.  
        ** 
        ** The only difference between state 1 and state 2 is that if the
        ** integer encountered in state 1 is not 0 or 1, then we need to
        ** increment the column 0 "nDoc" count for this term.
        */
        case 1:
          assert( iCol==0 );
          if( v>1 ){
            pCsr->aStat[1].nDoc++;
          }
          eState = 2;
          /* fall through */

        case 2:
          if( v==0 ){       /* 0x00. Next integer will be a docid. */
            eState = 0;
          }else if( v==1 ){ /* 0x01. Next integer will be a column number. */
            eState = 3;
          }else{            /* 2 or greater. A position. */
            pCsr->aStat[iCol+1].nOcc++;
            pCsr->aStat[0].nOcc++;
          }
          break;

        /* State 3. The integer just read is a column number. */
        default: assert( eState==3 );
          iCol = (int)v;
          if( fts3auxGrowStatArray(pCsr, iCol+2) ) return SQLITE_NOMEM;
          pCsr->aStat[iCol+1].nDoc++;
          eState = 2;
          break;
      }
    }

    pCsr->iCol = 0;
    rc = SQLITE_OK;
  }else{
    pCsr->isEof = 1;
  }
  return rc;
}